

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long *param_2,undefined8 param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  long lVar1;
  StringPtr local_28;
  long local_18;
  long local_10;
  
  lVar1 = param_2[1];
  local_18 = lVar1;
  if (lVar1 != 0) {
    local_18 = *param_2;
  }
  local_10 = 0;
  if (lVar1 != 0) {
    local_10 = lVar1 + -1;
  }
  local_28.content.ptr = (char *)param_2[4];
  local_28.content.size_ = param_2[5];
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_18,(ArrayPtr<const_char> *)(param_2 + 6),&local_28,
             param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}